

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)

{
  xmlDocPtr pxVar1;
  xmlRelaxNGParserCtxtPtr __s;
  void **ppvVar2;
  
  if ((doc != (xmlDocPtr)0x0) && (pxVar1 = xmlCopyDoc(doc,1), pxVar1 != (xmlDocPtr)0x0)) {
    __s = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x100);
    if (__s != (xmlRelaxNGParserCtxtPtr)0x0) {
      memset(__s,0,0x100);
      __s->document = pxVar1;
      __s->freedoc = 1;
      ppvVar2 = __xmlGenericErrorContext();
      __s->userData = *ppvVar2;
      return __s;
    }
    xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0,"building parser\n");
    return (xmlRelaxNGParserCtxtPtr)0x0;
  }
  return (xmlRelaxNGParserCtxtPtr)0x0;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewDocParserCtxt(xmlDocPtr doc)
{
    xmlRelaxNGParserCtxtPtr ret;
    xmlDocPtr copy;

    if (doc == NULL)
        return (NULL);
    copy = xmlCopyDoc(doc, 1);
    if (copy == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL, "building parser\n");
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->document = copy;
    ret->freedoc = 1;
    ret->userData = xmlGenericErrorContext;
    return (ret);
}